

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniball.hpp
# Opt level: O2

NT __thiscall
Miniball::
Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
::excess(Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
         *this,Pit pit)

{
  ulong uVar1;
  ulong uVar2;
  NT NVar3;
  float fVar4;
  
  NVar3 = -this->current_sqr_r;
  uVar2 = 0;
  uVar1 = (ulong)(uint)this->d;
  if (this->d < 1) {
    uVar1 = uVar2;
  }
  for (; (int)uVar1 != (int)uVar2; uVar2 = uVar2 + 1) {
    fVar4 = (*pit._M_current)[uVar2] - this->current_c[uVar2];
    NVar3 = NVar3 + fVar4 * fVar4;
  }
  return NVar3;
}

Assistant:

inline  Cit operator() (Pit it) const { return *it; }